

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O0

JavascriptPromise * __thiscall
JsUtil::Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::Pop
          (Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> *this)

{
  Type pJVar1;
  int iVar2;
  Type *ppJVar3;
  JavascriptPromise *item;
  Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> *this_local;
  
  iVar2 = ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                      *)this);
  ppJVar3 = List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(&this->list,iVar2 + -1);
  pJVar1 = *ppJVar3;
  iVar2 = ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                      *)this);
  List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::RemoveAt(&this->list,iVar2 + -1);
  return pJVar1;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }